

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_importUnitsThatEncounterARelatedImportError_Test::
~Importer_importUnitsThatEncounterARelatedImportError_Test
          (Importer_importUnitsThatEncounterARelatedImportError_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, importUnitsThatEncounterARelatedImportError)
{
    const std::string e = "Encountered an error when resolving units 'unitsB_imported' from '" + resourcePath("importer/simple_model.cellml") + "'.";
    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/import_invalid_component.cellml"));
    model->component(0)->setImportReference("component4");
    model->component(0)->setName("component4_imported");

    importer->resolveImports(model, resourcePath("importer"));
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(e, importer->error(0)->description());
}